

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntercomSignalPdu.cpp
# Opt level: O1

void __thiscall DIS::IntercomSignalPdu::~IntercomSignalPdu(IntercomSignalPdu *this)

{
  pointer puVar1;
  
  (this->super_RadioCommunicationsFamilyPdu).super_Pdu.super_PduSuperclass._vptr_PduSuperclass =
       (_func_int **)&PTR__IntercomSignalPdu_001b4f40;
  puVar1 = (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  EntityID::~EntityID(&this->_entityID);
  RadioCommunicationsFamilyPdu::~RadioCommunicationsFamilyPdu
            (&this->super_RadioCommunicationsFamilyPdu);
  return;
}

Assistant:

IntercomSignalPdu::~IntercomSignalPdu() { _data.clear(); }